

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O3

void __thiscall Darts::Details::BitVector::build(BitVector *this)

{
  uint *puVar1;
  char *pcVar2;
  uint *temp;
  uint *puVar3;
  ulong uVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  
  uVar7 = (this->units_).size_;
  puVar3 = (uint *)operator_new__(-(ulong)(uVar7 >> 0x3e != 0) | uVar7 * 4);
  puVar1 = (this->ranks_).array_;
  (this->ranks_).array_ = puVar3;
  if (puVar1 != (uint *)0x0) {
    operator_delete__(puVar1);
    uVar7 = (this->units_).size_;
  }
  this->num_ones_ = 0;
  if (uVar7 != 0) {
    pcVar2 = (this->units_).buf_.array_;
    puVar1 = (this->ranks_).array_;
    uVar4 = 0;
    sVar6 = 0;
    do {
      puVar1[uVar4] = (uint)sVar6;
      uVar5 = *(uint *)(pcVar2 + uVar4 * 4);
      uVar5 = (uVar5 & 0x55555555) + (uVar5 >> 1 & 0x55555555);
      uVar5 = (uVar5 & 0x33333333) + (uVar5 >> 2 & 0x33333333);
      uVar5 = (uVar5 >> 4) + uVar5 & 0xf0f0f0f;
      uVar5 = (uVar5 >> 8) + uVar5;
      sVar6 = ((uVar5 >> 0x10) + uVar5 & 0xff) + sVar6;
      uVar4 = uVar4 + 1;
    } while (uVar7 != uVar4);
    this->num_ones_ = sVar6;
  }
  return;
}

Assistant:

inline void BitVector::build() {
  try {
    ranks_.reset(new id_type[units_.size()]);
  } catch (const std::bad_alloc &) {
    DARTS_THROW("failed to build rank index: std::bad_alloc");
  }

  num_ones_ = 0;
  for (std::size_t i = 0; i < units_.size(); ++i) {
    ranks_[i] = num_ones_;
    num_ones_ += pop_count(units_[i]);
  }
}